

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::RunContext::sectionEnded
          (RunContext *this,SectionInfo *info,Counts *prevAssertions,double _durationInSeconds)

{
  IStreamingReporter *pIVar1;
  char cVar2;
  bool _missingAssertions;
  Counts local_d8;
  SectionStats local_c0;
  
  cVar2 = std::uncaught_exception();
  if (cVar2 == '\0') {
    local_d8.passed = (this->m_totals).assertions.passed - prevAssertions->passed;
    local_d8.failed = (this->m_totals).assertions.failed - prevAssertions->failed;
    _missingAssertions = testForMissingAssertions(this,&local_d8);
    SectionTracking::TestCaseTracker::leaveSection((this->m_testCaseTracker).nullableValue);
    pIVar1 = (this->m_reporter).m_p;
    SectionStats::SectionStats(&local_c0,info,&local_d8,_durationInSeconds,_missingAssertions);
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar1,&local_c0);
    SectionStats::~SectionStats(&local_c0);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  }
  else {
    SectionInfo::SectionInfo((SectionInfo *)&local_c0,info);
    local_c0.sectionInfo.lineInfo.line = prevAssertions->passed;
    local_c0.assertions.passed = prevAssertions->failed;
    local_c0.assertions.failed = (size_t)_durationInSeconds;
    std::
    vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
    ::emplace_back<Catch::RunContext::UnfinishedSections>
              (&this->m_unfinishedSections,(UnfinishedSections *)&local_c0);
    SectionInfo::~SectionInfo((SectionInfo *)&local_c0);
  }
  return;
}

Assistant:

virtual void sectionEnded( SectionInfo const& info, Counts const& prevAssertions, double _durationInSeconds ) {
            if( std::uncaught_exception() ) {
                m_unfinishedSections.push_back( UnfinishedSections( info, prevAssertions, _durationInSeconds ) );
                return;
            }

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            m_testCaseTracker->leaveSection();

            m_reporter->sectionEnded( SectionStats( info, assertions, _durationInSeconds, missingAssertions ) );
            m_messages.clear();
        }